

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

uint32_t run_container_rank_many
                   (run_container_t *container,uint64_t start_rank,uint32_t *begin,uint32_t *end,
                   uint64_t *ans)

{
  uint32_t uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint32_t endpoint;
  uint32_t length;
  uint32_t startpoint;
  uint32_t x32;
  uint16_t xhigh;
  uint32_t x;
  int i;
  int sum;
  uint32_t *iter;
  uint16_t high;
  uint64_t *ans_local;
  uint32_t *end_local;
  uint32_t *begin_local;
  uint64_t start_rank_local;
  run_container_t *container_local;
  
  uVar1 = *begin;
  sum = 0;
  i = 0;
  iter = begin;
  ans_local = ans;
  do {
    if (iter == end) {
      return (uint32_t)((long)iter - (long)begin >> 2);
    }
    if ((short)(*iter >> 0x10) != (short)(uVar1 >> 0x10)) {
      return (uint32_t)((long)iter - (long)begin >> 2);
    }
    uVar2 = *iter & 0xffff;
    for (; i < container->n_runs; i = i + 1) {
      uVar3 = (uint)container->runs[i].value;
      uVar4 = (uint)container->runs[i].length;
      if (uVar2 <= uVar4 + uVar3) {
        if (uVar2 < uVar3) {
          *ans_local = start_rank + (long)sum;
        }
        else {
          *ans_local = start_rank + (long)sum + (ulong)(uVar2 - uVar3) + 1;
        }
        ans_local = ans_local + 1;
        break;
      }
      sum = uVar4 + 1 + sum;
    }
    if (container->n_runs <= i) {
      *ans_local = start_rank + (long)sum;
      ans_local = ans_local + 1;
    }
    iter = iter + 1;
  } while( true );
}

Assistant:

uint32_t run_container_rank_many(const run_container_t *container,
                                 uint64_t start_rank, const uint32_t *begin,
                                 const uint32_t *end, uint64_t *ans) {
    const uint16_t high = (uint16_t)((*begin) >> 16);
    const uint32_t *iter = begin;
    int sum = 0;
    int i = 0;
    for (; iter != end; iter++) {
        uint32_t x = *iter;
        uint16_t xhigh = (uint16_t)(x >> 16);
        if (xhigh != high) return iter - begin;  // stop at next container

        uint32_t x32 = x & 0xFFFF;
        while (i < container->n_runs) {
            uint32_t startpoint = container->runs[i].value;
            uint32_t length = container->runs[i].length;
            uint32_t endpoint = length + startpoint;
            if (x32 <= endpoint) {
                if (x32 < startpoint) {
                    *(ans++) = start_rank + sum;
                } else {
                    *(ans++) = start_rank + sum + (x32 - startpoint) + 1;
                }
                break;
            } else {
                sum += length + 1;
                i++;
            }
        }
        if (i >= container->n_runs) *(ans++) = start_rank + sum;
    }

    return iter - begin;
}